

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O2

int __thiscall cppcms::util::stackbuf<128UL>::overflow(stackbuf<128UL> *this,int c)

{
  char *__dest;
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (*(undefined1 **)&this->field_0x20 == this->on_stack_) {
    __dest = (char *)malloc(0x101);
    this->on_heap_ = __dest;
    if (__dest == (char *)0x0) goto LAB_00212830;
    lVar3 = 0x80;
    memcpy(__dest,this->on_stack_,0x80);
    lVar1 = 0x100;
  }
  else {
    lVar3 = *(long *)&this->field_0x28 - (long)*(undefined1 **)&this->field_0x20;
    __dest = (char *)realloc(this->on_heap_,lVar3 * 2 + 1);
    if (__dest == (char *)0x0) {
LAB_00212830:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::__cxx11::string::resize;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    lVar1 = lVar3 * 2;
    this->on_heap_ = __dest;
    lVar3 = (long)(int)lVar3;
  }
  *(char **)&this->field_0x20 = __dest;
  *(char **)&this->field_0x30 = __dest + lVar1;
  *(char **)&this->field_0x28 = __dest + lVar3;
  if (c != -1) {
    std::streambuf::sputc((char)this);
  }
  return 0;
}

Assistant:

int overflow(int c)
		{
			size_t current_size;
			size_t new_size;
			if(pbase() == on_stack_) {
				current_size = OnStackSize;
				new_size = OnStackSize * 2;
				on_heap_ = (char *)malloc(new_size + 1);
				if(!on_heap_)
					throw std::bad_alloc();
				memcpy(on_heap_,on_stack_,current_size);
			}
			else {
				current_size = pptr() - pbase();
				new_size = current_size * 2;
				char *new_ptr = (char *)realloc(on_heap_,new_size + 1);
				if(!new_ptr)
					throw std::bad_alloc();
				on_heap_ = new_ptr;

			}
			setp(on_heap_,on_heap_ + new_size);
			pbump(current_size);
			if(c!=EOF)
				sputc(c);
			return 0;
		}